

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_abbrev.c
# Opt level: O0

int dwarf_get_abbrev(Dwarf_Debug dbg,Dwarf_Unsigned offset,Dwarf_Abbrev *returned_abbrev,
                    Dwarf_Unsigned *length,Dwarf_Unsigned *abbr_count,Dwarf_Error *error)

{
  Dwarf_Unsigned dbg_00;
  char *msg;
  Dwarf_Byte_Ptr pDVar1;
  undefined1 local_a0 [8];
  dwarfstring m;
  Dwarf_Unsigned DStack_78;
  int res;
  Dwarf_Unsigned abbrev_implicit_const_count_out;
  Dwarf_Unsigned utmp;
  Dwarf_Unsigned labbr_count;
  Dwarf_Abbrev ret_abbrev;
  Dwarf_Byte_Ptr abbrev_section_end;
  Dwarf_Byte_Ptr abbrev_ptr_out;
  Dwarf_Byte_Ptr abbrev_ptr;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *abbr_count_local;
  Dwarf_Unsigned *length_local;
  Dwarf_Abbrev *returned_abbrev_local;
  Dwarf_Unsigned offset_local;
  Dwarf_Debug dbg_local;
  
  abbrev_ptr_out = (Dwarf_Byte_Ptr)0x0;
  abbrev_section_end = (Dwarf_Byte_Ptr)0x0;
  ret_abbrev = (Dwarf_Abbrev)0x0;
  labbr_count = 0;
  utmp = 0;
  abbrev_implicit_const_count_out = 0;
  DStack_78 = 0;
  m._28_4_ = 0;
  abbrev_ptr = (Dwarf_Byte_Ptr)error;
  error_local = (Dwarf_Error *)abbr_count;
  abbr_count_local = length;
  length_local = (Dwarf_Unsigned *)returned_abbrev;
  returned_abbrev_local = (Dwarf_Abbrev *)offset;
  offset_local = (Dwarf_Unsigned)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_abbrev()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (((dbg->de_debug_abbrev).dss_data != (Dwarf_Small *)0x0) ||
          (dbg_local._4_4_ = _dwarf_load_debug_info(dbg,error), dbg_local._4_4_ == 0)) {
    m._28_4_ = 0;
    if (returned_abbrev_local < *(Dwarf_Abbrev **)(offset_local + 0x2d0)) {
      labbr_count = (Dwarf_Unsigned)_dwarf_get_alloc((Dwarf_Debug)offset_local,'\x12',1);
      if ((char *)labbr_count == (char *)0x0) {
        _dwarf_error((Dwarf_Debug)offset_local,(Dwarf_Error *)abbrev_ptr,0x3e);
        dbg_local._4_4_ = 1;
      }
      else {
        *(Dwarf_Unsigned *)(labbr_count + 0x20) = offset_local;
        if ((length_local == (Dwarf_Unsigned *)0x0) || (error_local == (Dwarf_Error *)0x0)) {
          dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
          _dwarf_error((Dwarf_Debug)offset_local,(Dwarf_Error *)abbrev_ptr,0x6e);
          dbg_local._4_4_ = 1;
        }
        else {
          *error_local = (Dwarf_Error)0x0;
          if (abbr_count_local != (Dwarf_Unsigned *)0x0) {
            *abbr_count_local = 1;
          }
          abbrev_ptr_out =
               (Dwarf_Byte_Ptr)(*(long *)(offset_local + 0x2c8) + (long)returned_abbrev_local);
          ret_abbrev = (Dwarf_Abbrev)
                       (*(long *)(offset_local + 0x2c8) + *(long *)(offset_local + 0x2d0));
          m._28_4_ = _dwarf_leb128_uword_wrapper
                               ((Dwarf_Debug)offset_local,&abbrev_ptr_out,(Dwarf_Small *)ret_abbrev,
                                &abbrev_implicit_const_count_out,(Dwarf_Error *)abbrev_ptr);
          if (m._28_4_ == 1) {
            dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
            dbg_local._4_4_ = m._28_4_;
          }
          else {
            *(Dwarf_Unsigned *)(labbr_count + 8) = abbrev_implicit_const_count_out;
            if (*(long *)(labbr_count + 8) == 0) {
              *length_local = labbr_count;
              *error_local = (Dwarf_Error)0x0;
              if (abbr_count_local != (Dwarf_Unsigned *)0x0) {
                *abbr_count_local = 1;
              }
              dbg_local._4_4_ = 0;
            }
            else {
              m._28_4_ = _dwarf_leb128_uword_wrapper
                                   ((Dwarf_Debug)offset_local,&abbrev_ptr_out,
                                    (Dwarf_Small *)ret_abbrev,&abbrev_implicit_const_count_out,
                                    (Dwarf_Error *)abbrev_ptr);
              if (m._28_4_ == 1) {
                dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
                dbg_local._4_4_ = m._28_4_;
              }
              else if (abbrev_implicit_const_count_out < 0x10000) {
                *(Dwarf_Unsigned *)labbr_count = abbrev_implicit_const_count_out;
                if (abbrev_ptr_out < ret_abbrev) {
                  pDVar1 = abbrev_ptr_out + 1;
                  *(Dwarf_Small *)(labbr_count + 0x10) = *abbrev_ptr_out;
                  *(Dwarf_Byte_Ptr *)(labbr_count + 0x18) = pDVar1;
                  *(Dwarf_Byte_Ptr *)(labbr_count + 0x40) = pDVar1;
                  *(undefined8 *)(labbr_count + 0x48) = 0;
                  abbrev_ptr_out = pDVar1;
                  m._28_4_ = _dwarf_count_abbrev_entries
                                       ((Dwarf_Debug)offset_local,pDVar1,(Dwarf_Byte_Ptr)ret_abbrev,
                                        &utmp,&stack0xffffffffffffff88,&abbrev_section_end,
                                        (Dwarf_Error *)abbrev_ptr);
                  if (m._28_4_ == 1) {
                    dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
                    dbg_local._4_4_ = m._28_4_;
                  }
                  else {
                    abbrev_ptr_out = abbrev_section_end;
                    *(Dwarf_Abbrev **)(labbr_count + 0x28) = returned_abbrev_local;
                    *(Dwarf_Unsigned *)(labbr_count + 0x30) = utmp;
                    *(Dwarf_Unsigned *)(labbr_count + 0x38) = DStack_78;
                    if (ret_abbrev < abbrev_section_end) {
                      dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
                      _dwarf_error_string((Dwarf_Debug)offset_local,(Dwarf_Error *)abbrev_ptr,0x6d,
                                          "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end of the abbrev section reading abbrev_entries."
                                         );
                      _dwarf_error((Dwarf_Debug)offset_local,(Dwarf_Error *)abbrev_ptr,0x6d);
                      dbg_local._4_4_ = 1;
                    }
                    else {
                      if (abbr_count_local != (Dwarf_Unsigned *)0x0) {
                        *abbr_count_local =
                             (Dwarf_Unsigned)
                             (abbrev_section_end +
                             (-(long)returned_abbrev_local - *(long *)(offset_local + 0x2c8)));
                      }
                      *length_local = labbr_count;
                      *error_local = (Dwarf_Error)utmp;
                      dbg_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
                  dwarfstring_constructor((dwarfstring_s *)local_a0);
                  dwarfstring_append_printf_u
                            ((dwarfstring *)local_a0,
                             "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end of the abbrev section reading tag, starting at abbrev section offset 0x%x"
                             ,(dwarfstring_u)returned_abbrev_local);
                  dbg_00 = offset_local;
                  pDVar1 = abbrev_ptr;
                  msg = dwarfstring_string((dwarfstring_s *)local_a0);
                  _dwarf_error_string((Dwarf_Debug)dbg_00,(Dwarf_Error *)pDVar1,0x6d,msg);
                  dwarfstring_destructor((dwarfstring_s *)local_a0);
                  dbg_local._4_4_ = 1;
                }
              }
              else {
                dwarf_dealloc((Dwarf_Debug)offset_local,(Dwarf_Ptr)labbr_count,0x12);
                dbg_local._4_4_ =
                     _dwarf_format_TAG_err_msg
                               ((Dwarf_Debug)offset_local,abbrev_implicit_const_count_out,
                                "DW_DLE_TAG_CORRUPT",(Dwarf_Error *)abbrev_ptr);
              }
            }
          }
        }
      }
    }
    else {
      dbg_local._4_4_ = -1;
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_abbrev(Dwarf_Debug dbg,
    Dwarf_Unsigned offset,
    Dwarf_Abbrev * returned_abbrev,
    Dwarf_Unsigned * length,
    Dwarf_Unsigned * abbr_count, Dwarf_Error * error)
{
    Dwarf_Byte_Ptr abbrev_ptr = 0;
    Dwarf_Byte_Ptr abbrev_ptr_out = 0;
    Dwarf_Byte_Ptr abbrev_section_end = 0;
    Dwarf_Abbrev ret_abbrev = 0;
    Dwarf_Unsigned labbr_count = 0;
    Dwarf_Unsigned utmp     = 0;
    Dwarf_Unsigned abbrev_implicit_const_count_out = 0;
    int res = 0;

    CHECK_DBG(dbg,error,"dwarf_get_abbrev()");
    if (dbg->de_debug_abbrev.dss_data == 0) {
        /*  Loads abbrev section (and .debug_info as we do those
            together). */
        res = _dwarf_load_debug_info(dbg, error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }

    if (offset >= dbg->de_debug_abbrev.dss_size) {
        return DW_DLV_NO_ENTRY;
    }
    ret_abbrev = (Dwarf_Abbrev) _dwarf_get_alloc(dbg,
        DW_DLA_ABBREV, 1);
    if (ret_abbrev == NULL) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    ret_abbrev->dab_dbg = dbg;
    if (returned_abbrev == 0 || abbr_count == 0) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        _dwarf_error(dbg, error, DW_DLE_DWARF_ABBREV_NULL);
        return DW_DLV_ERROR;
    }

    *abbr_count = 0;
    if (length) {
        *length = 1;
    }

    abbrev_ptr = dbg->de_debug_abbrev.dss_data + offset;
    abbrev_section_end =
        dbg->de_debug_abbrev.dss_data + dbg->de_debug_abbrev.dss_size;
    res = _dwarf_leb128_uword_wrapper(dbg,&abbrev_ptr,
        abbrev_section_end,&utmp,error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return res;
    }
    ret_abbrev->dab_code = utmp;
    if (ret_abbrev->dab_code == 0) {
        *returned_abbrev = ret_abbrev;
        *abbr_count = 0;
        if (length) {
            *length = 1;
        }
        return DW_DLV_OK;
    }

    res = _dwarf_leb128_uword_wrapper(dbg,&abbrev_ptr,
        abbrev_section_end,&utmp,error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return res;
    }
    if (utmp > DW_TAG_hi_user) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return _dwarf_format_TAG_err_msg(dbg,
            utmp,"DW_DLE_TAG_CORRUPT",
            error);
    }
    ret_abbrev->dab_tag = utmp;
    if (abbrev_ptr >= abbrev_section_end) {
        dwarfstring m;

        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end "
            "of the abbrev section reading tag, starting at"
            " abbrev section offset 0x%x",offset);
        _dwarf_error_string(dbg, error,
            DW_DLE_ABBREV_DECODE_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    ret_abbrev->dab_has_child = *(abbrev_ptr++);
    ret_abbrev->dab_abbrev_ptr = abbrev_ptr;
    ret_abbrev->dab_next_ptr = abbrev_ptr;
    ret_abbrev->dab_next_index = 0;
    res = _dwarf_count_abbrev_entries(dbg,abbrev_ptr,
        abbrev_section_end,&labbr_count,
        &abbrev_implicit_const_count_out,
        &abbrev_ptr_out,error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return res;
    }
    abbrev_ptr = abbrev_ptr_out;

    /* Global section offset. */
    ret_abbrev->dab_goffset = offset;
    ret_abbrev->dab_count = labbr_count;
    ret_abbrev->dab_implicit_count = abbrev_implicit_const_count_out;
    if (abbrev_ptr > abbrev_section_end) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        _dwarf_error_string(dbg, error,
            DW_DLE_ABBREV_DECODE_ERROR,
            "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end "
            "of the abbrev section reading abbrev_entries.");
        _dwarf_error(dbg, error, DW_DLE_ABBREV_DECODE_ERROR);
        return DW_DLV_ERROR;
    }
    if (length) {
        *length = abbrev_ptr - dbg->de_debug_abbrev.dss_data - offset;
    }
    *returned_abbrev = ret_abbrev;
    *abbr_count = labbr_count;
    return DW_DLV_OK;
}